

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist_reverse.c
# Opt level: O3

void linkedlist_reverse(s_linkedlist *linked_list)

{
  void *pvVar1;
  s_linkedlist_node *psVar2;
  s_linkedlist_node *psVar3;
  
  psVar2 = linked_list->head;
  psVar3 = linked_list->tail;
  if (psVar2 != psVar3) {
    do {
      pvVar1 = psVar2->element;
      psVar2->element = psVar3->element;
      psVar3->element = pvVar1;
      psVar3 = psVar3->previous;
      psVar2 = psVar2->next;
    } while (psVar2 != psVar3);
  }
  return;
}

Assistant:

void linkedlist_reverse(s_linkedlist *linked_list) {
    s_linkedlist_node *front = linked_list->head;
    s_linkedlist_node *back  = linked_list->tail;

    while (front != back) {
        linkedlistnode_swap(front, back);

        front = front->next;
        back  = back->previous;
    }
}